

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void mjs::throw_runtime_error(string_view *s,char *file,int line)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  ostream *poVar1;
  runtime_error *this;
  string local_1d8 [32];
  size_t local_1b8;
  char *pcStack_1b0;
  ostringstream local_198 [8];
  ostringstream oss;
  int line_local;
  char *file_local;
  string_view *s_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,file);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1,": ");
  local_1b8 = s->_M_len;
  pcStack_1b0 = s->_M_str;
  __str._M_len = s->_M_len;
  __str._M_str = s->_M_str;
  std::operator<<(poVar1,__str);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_1d8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] void throw_runtime_error(const std::string_view& s, const char* file, int line) {
    std::ostringstream oss;
    oss << file << ":" << line << ": " << s;
    throw std::runtime_error(oss.str());
}